

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

bool __thiscall xatlas::internal::UniformGrid2::createGrid(UniformGrid2 *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint *puVar4;
  float fVar5;
  float fVar6;
  Vector2 p;
  uint local_84;
  uint32_t *local_80;
  uint32_t *nextOffset;
  uint32_t local_70;
  uint32_t offset;
  uint32_t cell;
  uint32_t j;
  Vector2 local_60;
  uint32_t local_58;
  float local_54;
  uint32_t edge_1;
  uint32_t i_2;
  uint32_t i_1;
  Vector2 extentsSize;
  float local_30;
  uint32_t edge;
  uint32_t i;
  Extents2 edgeExtents;
  uint32_t edgeCount;
  UniformGrid2 *this_local;
  
  unique0x100003a1 = this;
  edgeExtents.max.x = (float)Array<unsigned_int>::size(&this->m_edges);
  Extents2::Extents2((Extents2 *)&edge);
  Extents2::reset((Extents2 *)&edge);
  for (local_30 = 0.0; (uint)local_30 < (uint)edgeExtents.max.x;
      local_30 = (float)((int)local_30 + 1)) {
    puVar4 = Array<unsigned_int>::operator[](&this->m_edges,(uint32_t)local_30);
    uVar3 = *puVar4;
    p = edgePosition0(this,uVar3);
    Extents2::add((Extents2 *)&edge,p);
    extentsSize = edgePosition1(this,uVar3);
    Extents2::add((Extents2 *)&edge,extentsSize);
  }
  this->m_gridOrigin = _edge;
  _i_2 = operator-(&edgeExtents.min,(Vector2 *)&edge);
  fVar5 = min<float>((float *)&i_2,(float *)&i_1);
  fVar6 = sqrtf((float)(uint)edgeExtents.max.x);
  this->m_cellSize = fVar5 / fVar6;
  if (0.0 < this->m_cellSize) {
    fVar5 = ceilf((float)i_2 / this->m_cellSize);
    this->m_gridWidth = (uint32_t)(long)fVar5;
    fVar5 = ceilf((float)i_1 / this->m_cellSize);
    this->m_gridHeight = (uint32_t)(long)fVar5;
    if ((this->m_gridWidth == 0) || (this->m_gridHeight == 0)) {
      this_local._7_1_ = false;
    }
    else {
      Array<unsigned_int>::resize(&this->m_cellDataOffsets,this->m_gridWidth * this->m_gridHeight);
      for (edge_1 = 0; uVar3 = edge_1, uVar2 = Array<unsigned_int>::size(&this->m_cellDataOffsets),
          uVar3 < uVar2; edge_1 = edge_1 + 1) {
        puVar4 = Array<unsigned_int>::operator[](&this->m_cellDataOffsets,edge_1);
        *puVar4 = 0xffffffff;
      }
      Array<unsigned_int>::clear(&this->m_cellData);
      Array<unsigned_int>::reserve(&this->m_cellData,(int)edgeExtents.max.x << 1);
      for (local_54 = 0.0; (uint)local_54 < (uint)edgeExtents.max.x;
          local_54 = (float)((int)local_54 + 1)) {
        puVar4 = Array<unsigned_int>::operator[](&this->m_edges,(uint32_t)local_54);
        local_58 = *puVar4;
        local_60 = edgePosition0(this,local_58);
        _cell = edgePosition1(this,local_58);
        traverse(this,local_60,_cell);
        bVar1 = Array<unsigned_int>::isEmpty(&this->m_traversedCellOffsets);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          __assert_fail("!m_traversedCellOffsets.isEmpty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x1022,"bool xatlas::internal::UniformGrid2::createGrid()");
        }
        for (offset = 0; uVar3 = offset,
            uVar2 = Array<unsigned_int>::size(&this->m_traversedCellOffsets), uVar3 < uVar2;
            offset = offset + 1) {
          puVar4 = Array<unsigned_int>::operator[](&this->m_traversedCellOffsets,offset);
          local_70 = *puVar4;
          puVar4 = Array<unsigned_int>::operator[](&this->m_cellDataOffsets,local_70);
          nextOffset._4_4_ = *puVar4;
          if (nextOffset._4_4_ == 0xffffffff) {
            uVar3 = Array<unsigned_int>::size(&this->m_cellData);
            puVar4 = Array<unsigned_int>::operator[](&this->m_cellDataOffsets,local_70);
            *puVar4 = uVar3;
          }
          else {
            while (local_80 = Array<unsigned_int>::operator[]
                                        (&this->m_cellData,nextOffset._4_4_ + 1),
                  *local_80 != 0xffffffff) {
              nextOffset._4_4_ = *local_80;
            }
            uVar3 = Array<unsigned_int>::size(&this->m_cellData);
            *local_80 = uVar3;
          }
          Array<unsigned_int>::push_back(&this->m_cellData,&local_58);
          local_84 = 0xffffffff;
          Array<unsigned_int>::push_back(&this->m_cellData,&local_84);
        }
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool createGrid()
	{
		// Compute edge extents. Min will be the grid origin.
		const uint32_t edgeCount = m_edges.size();
		Extents2 edgeExtents;
		edgeExtents.reset();
		for (uint32_t i = 0; i < edgeCount; i++) {
			const uint32_t edge = m_edges[i];
			edgeExtents.add(edgePosition0(edge));
			edgeExtents.add(edgePosition1(edge));
		}
		m_gridOrigin = edgeExtents.min;
		// Size grid to approximately one edge per cell.
		const Vector2 extentsSize(edgeExtents.max - edgeExtents.min);
		m_cellSize = min(extentsSize.x, extentsSize.y) / sqrtf((float)edgeCount);
		if (m_cellSize <= 0.0f)
			return false;
		m_gridWidth = uint32_t(ceilf(extentsSize.x / m_cellSize));
		m_gridHeight = uint32_t(ceilf(extentsSize.y / m_cellSize));
		if (m_gridWidth == 0 || m_gridHeight == 0)
			return false;
		// Insert edges into cells.
		m_cellDataOffsets.resize(m_gridWidth * m_gridHeight);
		for (uint32_t i = 0; i < m_cellDataOffsets.size(); i++)
			m_cellDataOffsets[i] = UINT32_MAX;
		m_cellData.clear();
		m_cellData.reserve(edgeCount * 2);
		for (uint32_t i = 0; i < edgeCount; i++) {
			const uint32_t edge = m_edges[i];
			traverse(edgePosition0(edge), edgePosition1(edge));
			XA_DEBUG_ASSERT(!m_traversedCellOffsets.isEmpty());
			for (uint32_t j = 0; j < m_traversedCellOffsets.size(); j++) {
				const uint32_t cell = m_traversedCellOffsets[j];
				uint32_t offset = m_cellDataOffsets[cell];
				if (offset == UINT32_MAX)
					m_cellDataOffsets[cell] = m_cellData.size();
				else {
					for (;;) {
						uint32_t &nextOffset = m_cellData[offset + 1];
						if (nextOffset == UINT32_MAX) {
							nextOffset = m_cellData.size();
							break;
						}
						offset = nextOffset;
					}
				}
				m_cellData.push_back(edge);
				m_cellData.push_back(UINT32_MAX);
			}
		}
		return true;
	}